

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

HistoryEpochPtr __thiscall
libcellml::createHistoryEpoch
          (libcellml *this,UnitsConstPtr *units,string *sourceUrl,string *destinationUrl)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<libcellml::HistoryEpoch> sVar2;
  HistoryEpochPtr HVar3;
  ImportedEntityConstPtr IStack_28;
  
  sVar2 = std::
          make_shared<libcellml::HistoryEpoch,std::shared_ptr<libcellml::Units_const>const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
                    ((shared_ptr<const_libcellml::Units> *)this,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)units,
                     sourceUrl);
  _Var1 = sVar2.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if (destinationUrl->_M_string_length == 0) {
    std::__shared_ptr<libcellml::ImportedEntity_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libcellml::Units_const,void>
              ((__shared_ptr<libcellml::ImportedEntity_const,(__gnu_cxx::_Lock_policy)2> *)
               &IStack_28,
               &units->super___shared_ptr<const_libcellml::Units,_(__gnu_cxx::_Lock_policy)2>);
    recordUrl((HistoryEpochPtr *)this,&IStack_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&IStack_28.
                super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    _Var1._M_pi = extraout_RDX;
  }
  HVar3.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  HVar3.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (HistoryEpochPtr)
         HVar3.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

HistoryEpochPtr createHistoryEpoch(const UnitsConstPtr &units, const std::string &sourceUrl, const std::string &destinationUrl)
{
    auto h = std::make_shared<HistoryEpoch>(units, sourceUrl, destinationUrl);
    if (destinationUrl.empty()) {
        recordUrl(h, units);
    }
    return h;
}